

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  float fVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  short sVar4;
  float *pfVar5;
  float *pfVar6;
  short sVar7;
  float in_ECX;
  uint in_EDX;
  long in_RSI;
  ImVector<ImVec2> *in_RDI;
  float fVar8;
  int i_2;
  int i_1;
  int vtx_count_1;
  int idx_count_1;
  float inv_len2;
  float d2_1;
  float dm_y;
  float dm_x;
  ImVec2 *n1;
  ImVec2 *n0;
  int i1_1;
  int i0_1;
  float inv_len;
  float d2;
  float dy;
  float dx;
  ImVec2 *p1;
  ImVec2 *p0;
  int i1;
  int i0;
  ImVec2 *temp_normals;
  int i;
  uint vtx_outer_idx;
  uint vtx_inner_idx;
  int vtx_count;
  int idx_count;
  ImU32 col_trans;
  float AA_SIZE;
  ImVec2 uv;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int iVar9;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar10;
  undefined4 in_stack_ffffffffffffff64;
  float local_98;
  float local_90;
  float local_8c;
  int local_78;
  int local_74;
  float local_68;
  float local_64;
  int local_50;
  int local_4c;
  int local_3c;
  
  if (2 < (int)in_EDX) {
    IVar2 = *in_RDI[3].Data;
    if ((in_RDI[3].Size & 4U) == 0) {
      uVar10 = in_EDX;
      PrimReserve((ImDrawList *)CONCAT44((in_EDX - 2) * 3,in_EDX),in_stack_ffffffffffffff5c,
                  in_stack_ffffffffffffff58);
      for (iVar9 = 0; iVar9 < (int)uVar10; iVar9 = iVar9 + 1) {
        *in_RDI[4].Data = *(ImVec2 *)(in_RSI + (long)iVar9 * 8);
        in_RDI[4].Data[1] = IVar2;
        in_RDI[4].Data[2].x = in_ECX;
        in_RDI[4].Data = (ImVec2 *)&in_RDI[4].Data[2].y;
      }
      for (iVar9 = 2; iVar9 < (int)in_EDX; iVar9 = iVar9 + 1) {
        **(undefined2 **)(in_RDI + 5) = (short)in_RDI[3].Capacity;
        *(short *)(*(long *)(in_RDI + 5) + 2) = (short)in_RDI[3].Capacity + (short)iVar9 + -1;
        *(short *)(*(long *)(in_RDI + 5) + 4) = (short)in_RDI[3].Capacity + (short)iVar9;
        *(long *)(in_RDI + 5) = *(long *)(in_RDI + 5) + 6;
      }
      in_RDI[3].Capacity = (uVar10 & 0xffff) + in_RDI[3].Capacity;
    }
    else {
      fVar1 = (float)in_RDI[0xc].Size;
      PrimReserve((ImDrawList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      iVar9 = in_RDI[3].Capacity;
      sVar4 = (short)in_RDI[3].Capacity + 1;
      for (local_3c = 2; sVar7 = (short)iVar9, local_3c < (int)in_EDX; local_3c = local_3c + 1) {
        **(short **)(in_RDI + 5) = sVar7;
        *(short *)(*(long *)(in_RDI + 5) + 2) = sVar7 + ((short)local_3c + -1) * 2;
        *(short *)(*(long *)(in_RDI + 5) + 4) = sVar7 + (short)(local_3c << 1);
        *(long *)(in_RDI + 5) = *(long *)(in_RDI + 5) + 6;
      }
      ImVector<ImVec2>::reserve_discard(in_RDI,in_stack_ffffffffffffff4c);
      IVar3 = in_RDI[3].Data[7];
      local_4c = in_EDX - 1;
      for (local_50 = 0; local_50 < (int)in_EDX; local_50 = local_50 + 1) {
        pfVar5 = (float *)(in_RSI + (long)local_4c * 8);
        pfVar6 = (float *)(in_RSI + (long)local_50 * 8);
        local_64 = *pfVar6 - *pfVar5;
        local_68 = pfVar6[1] - pfVar5[1];
        if (0.0 < local_64 * local_64 + local_68 * local_68) {
          fVar8 = ImRsqrt(0.0);
          local_64 = fVar8 * local_64;
          local_68 = fVar8 * local_68;
        }
        *(float *)((long)IVar3 + (long)local_4c * 8) = local_68;
        *(float *)((long)IVar3 + 4 + (long)local_4c * 8) = -local_64;
        local_4c = local_50;
      }
      local_74 = in_EDX - 1;
      for (local_78 = 0; local_78 < (int)in_EDX; local_78 = local_78 + 1) {
        pfVar5 = (float *)((long)IVar3 + (long)local_74 * 8);
        pfVar6 = (float *)((long)IVar3 + (long)local_78 * 8);
        local_8c = (*pfVar5 + *pfVar6) * 0.5;
        local_90 = (pfVar5[1] + pfVar6[1]) * 0.5;
        local_98 = local_8c * local_8c + local_90 * local_90;
        if (1e-06 < local_98) {
          local_98 = 1.0 / local_98;
          if (100.0 < local_98) {
            local_98 = 100.0;
          }
          local_8c = local_98 * local_8c;
          local_90 = local_98 * local_90;
        }
        local_8c = fVar1 * 0.5 * local_8c;
        local_90 = fVar1 * 0.5 * local_90;
        (in_RDI[4].Data)->x = *(float *)(in_RSI + (long)local_78 * 8) - local_8c;
        (in_RDI[4].Data)->y = *(float *)(in_RSI + 4 + (long)local_78 * 8) - local_90;
        in_RDI[4].Data[1] = IVar2;
        in_RDI[4].Data[2].x = in_ECX;
        in_RDI[4].Data[2].y = *(float *)(in_RSI + (long)local_78 * 8) + local_8c;
        in_RDI[4].Data[3].x = *(float *)(in_RSI + 4 + (long)local_78 * 8) + local_90;
        *(ImVec2 *)&in_RDI[4].Data[3].y = IVar2;
        in_RDI[4].Data[4].y = (float)((uint)in_ECX & 0xffffff);
        in_RDI[4].Data = in_RDI[4].Data + 5;
        **(short **)(in_RDI + 5) = sVar7 + (short)(local_78 << 1);
        *(short *)(*(long *)(in_RDI + 5) + 2) = sVar7 + (short)(local_74 << 1);
        *(short *)(*(long *)(in_RDI + 5) + 4) = sVar4 + (short)(local_74 << 1);
        *(short *)(*(long *)(in_RDI + 5) + 6) = sVar4 + (short)(local_74 << 1);
        *(short *)(*(long *)(in_RDI + 5) + 8) = sVar4 + (short)(local_78 << 1);
        *(short *)(*(long *)(in_RDI + 5) + 10) = sVar7 + (short)(local_78 << 1);
        *(long *)(in_RDI + 5) = *(long *)(in_RDI + 5) + 0xc;
        local_74 = local_78;
      }
      in_RDI[3].Capacity = (in_EDX & 0x7fff) * 2 + in_RDI[3].Capacity;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2)*3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + ((i - 1) << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (i << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        _Data->TempBuffer.reserve_discard(points_count);
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + i - 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}